

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

int __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldMetadata
          (MessageGenerator *this,Printer *printer)

{
  uint uVar1;
  int iVar2;
  EnforceOptimizeMode EVar3;
  FieldDescriptor *pFVar4;
  ExtensionRange *pEVar5;
  ExtensionRange *pEVar6;
  byte bVar7;
  pointer ppEVar8;
  pointer ppEVar9;
  bool bVar10;
  uint32 uVar11;
  int iVar12;
  FieldGenerator *pFVar13;
  mapped_type *pmVar14;
  Descriptor *pDVar15;
  LogMessage *other;
  long *plVar16;
  undefined8 *puVar17;
  undefined8 uVar18;
  ulong uVar19;
  size_t sVar20;
  ulong *puVar21;
  undefined1 *options;
  size_type *psVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  ExtensionRange *range;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *pFVar24;
  FieldDescriptor *field;
  ExtensionRange **ppEVar25;
  char *pcVar26;
  long lVar27;
  __normal_iterator<const_google::protobuf::Descriptor::ExtensionRange_**,_std::vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>_>
  __i;
  ExtensionRange **ppEVar28;
  long lVar29;
  ulong uVar30;
  string ptr;
  string serializer;
  uint32 tag;
  int type;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  Formatter format;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  sorted;
  _Alloc_hider local_208;
  size_type local_200;
  FieldDescriptor local_1f8 [8];
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  MessageGenerator *local_1c8;
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0 [2];
  uint local_188;
  uint local_184;
  key_type local_180;
  Options *local_160;
  string local_158;
  key_type local_138;
  string local_118;
  undefined1 local_f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  _Base_ptr local_d8;
  size_t local_d0;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  local_c8;
  FieldGeneratorMap *local_b0;
  undefined1 local_a8 [56];
  string local_70;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  local_a8._0_8_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_a8 + 8),&(this->variables_)._M_t);
  iVar12 = 0;
  if ((this->options_).table_driven_serialization != true) goto LAB_002942e1;
  anon_unknown_0::SortFieldsByNumber(&local_50,this->descriptor_);
  local_160 = &this->options_;
  local_1c8 = this;
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) != '\x01') {
    Formatter::operator()<>
              ((Formatter *)local_a8,
               "{PROTOBUF_FIELD_OFFSET($classtype$, _cached_size_), 0, 0, 0, nullptr},\n");
    local_c8.
    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (ExtensionRange **)0x0;
    local_c8.
    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (ExtensionRange **)0x0;
    local_c8.
    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (ExtensionRange **)0x0;
    local_38 = &this->variables_;
    std::
    vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
    ::reserve(&local_c8,(long)*(int *)(this->descriptor_ + 0x78));
    pDVar15 = this->descriptor_;
    if (0 < *(int *)(pDVar15 + 0x78)) {
      lVar29 = 0;
      lVar27 = 0;
      do {
        local_1c0._0_8_ = *(long *)(pDVar15 + 0x48) + lVar29;
        if (local_c8.
            super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_c8.
            super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
          ::_M_realloc_insert<google::protobuf::Descriptor::ExtensionRange_const*>
                    ((vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
                      *)&local_c8,
                     (iterator)
                     local_c8.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(ExtensionRange **)local_1c0);
        }
        else {
          *local_c8.
           super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
           ._M_impl.super__Vector_impl_data._M_finish = (ExtensionRange *)local_1c0._0_8_;
          local_c8.
          super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_c8.
               super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        lVar27 = lVar27 + 1;
        pDVar15 = this->descriptor_;
        lVar29 = lVar29 + 0x10;
      } while (lVar27 < *(int *)(pDVar15 + 0x78));
    }
    ppEVar9 = local_c8.
              super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppEVar8 = local_c8.
              super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_c8.
        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_c8.
        super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar29 = (long)local_c8.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_c8.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar19 = lVar29 >> 3;
      lVar27 = 0x3f;
      if (uVar19 != 0) {
        for (; uVar19 >> lVar27 == 0; lVar27 = lVar27 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
                (local_c8.
                 super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_c8.
                 super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar27 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar29 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
                  (ppEVar8,ppEVar9);
      }
      else {
        ppEVar28 = ppEVar8 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::cpp::(anonymous_namespace)::ExtensionRangeSorter>>
                  (ppEVar8,ppEVar28);
        for (; ppEVar28 != ppEVar9; ppEVar28 = ppEVar28 + 1) {
          pEVar5 = ppEVar28[-1];
          pEVar6 = *ppEVar28;
          iVar12 = pEVar6->start;
          iVar2 = pEVar5->start;
          ppEVar25 = ppEVar28;
          while (iVar12 < iVar2) {
            *ppEVar25 = pEVar5;
            pEVar5 = ppEVar25[-2];
            ppEVar25 = ppEVar25 + -1;
            iVar2 = pEVar5->start;
          }
          *ppEVar25 = pEVar6;
        }
      }
    }
    local_b0 = &this->field_generators_;
    lVar27 = 0;
    local_188 = 0;
    do {
      uVar19 = (ulong)(int)local_188;
      uVar30 = (long)local_c8.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_c8.
                     super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      if (uVar19 < uVar30) {
        do {
          pEVar5 = local_c8.
                   super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar19];
          if (((long)local_50.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_50.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3 != lVar27) &&
             (*(int *)(local_50.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar27] + 0x44) <= pEVar5->start))
          break;
          Formatter::operator()
                    ((Formatter *)local_a8,
                     "{PROTOBUF_FIELD_OFFSET($classtype$, _extensions_), $1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::ExtensionSerializer)},\n"
                     ,&pEVar5->start,&pEVar5->end);
          uVar19 = uVar19 + 1;
          uVar30 = (long)local_c8.
                         super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_c8.
                         super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
        } while (uVar19 < uVar30);
        local_188 = (uint)uVar19;
      }
      if ((long)local_50.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_50.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3 == lVar27) goto LAB_00294221;
      pFVar4 = local_50.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar27];
      iVar12 = *(int *)(pFVar4 + 0x44);
      if (*(once_flag **)(pFVar4 + 0x30) != (once_flag *)0x0) {
        local_1c0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_f8._0_8_ = pFVar4;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(pFVar4 + 0x30),(_func_void_FieldDescriptor_ptr **)local_1c0,
                   (FieldDescriptor **)local_f8);
      }
      local_184 = iVar12 << 3 |
                  *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                           (ulong)*(uint *)(pFVar4 + 0x38) * 4);
      bVar10 = FieldDescriptor::is_packed(pFVar4);
      if (bVar10) {
        local_184 = *(int *)(pFVar4 + 0x44) * 8 + 2;
      }
      FieldName_abi_cxx11_((string *)local_f8,(cpp *)pFVar4,field);
      if (*(long *)(pFVar4 + 0x58) != 0) {
        std::__cxx11::string::_M_assign((string *)local_f8);
      }
      local_1c0._0_8_ = local_1b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"field_name","");
      Formatter::Set<std::__cxx11::string>
                ((Formatter *)local_a8,(string *)local_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._0_8_ != local_1b0) {
        operator_delete((void *)local_1c0._0_8_);
      }
      local_208._M_p = (pointer)local_1f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"nullptr","");
      if (*(once_flag **)(pFVar4 + 0x30) != (once_flag *)0x0) {
        local_1c0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_1e8._0_8_ = pFVar4;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(pFVar4 + 0x30),(_func_void_FieldDescriptor_ptr **)local_1c0,
                   (FieldDescriptor **)local_1e8);
      }
      options = FieldDescriptor::kTypeToCppTypeMap;
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar4 + 0x38) * 4) == 10)
      {
        pDVar15 = FieldDescriptor::message_type(pFVar4);
        if (*(char *)(*(long *)(pDVar15 + 0x20) + 0x4b) != '\x01') {
          pDVar15 = FieldDescriptor::message_type(pFVar4);
          if (*(char *)(*(long *)(pDVar15 + 0x20) + 0x48) != '\0') goto LAB_00293deb;
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"TableStruct","");
          pDVar15 = FieldDescriptor::message_type(pFVar4);
          UniqueName(&local_70,&local_158,(string *)**(undefined8 **)(pDVar15 + 0x10),local_160);
          plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x3a8ad1);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          psVar22 = (size_type *)(plVar16 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar16 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar22) {
            local_118.field_2._M_allocated_capacity = *psVar22;
            local_118.field_2._8_8_ = plVar16[3];
          }
          else {
            local_118.field_2._M_allocated_capacity = *psVar22;
            local_118._M_dataplus._M_p = (pointer)*plVar16;
          }
          local_118._M_string_length = plVar16[1];
          *plVar16 = (long)psVar22;
          plVar16[1] = 0;
          *(undefined1 *)(plVar16 + 2) = 0;
          puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
          local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
          puVar21 = puVar17 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar17 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar21) {
            local_180.field_2._M_allocated_capacity = *puVar21;
            local_180.field_2._8_8_ = puVar17[3];
          }
          else {
            local_180.field_2._M_allocated_capacity = *puVar21;
            local_180._M_dataplus._M_p = (pointer)*puVar17;
          }
          local_180._M_string_length = puVar17[1];
          *puVar17 = puVar21;
          puVar17[1] = 0;
          *(undefined1 *)(puVar17 + 2) = 0;
          FieldDescriptor::message_type(pFVar4);
          iVar12 = anon_unknown_0::FindMessageIndexInFile
                             ((Descriptor *)
                              CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
          local_1c0._0_8_ = local_1b0;
          local_1c0._8_8_ = FastInt32ToBufferLeft(iVar12,local_1b0[0]._M_local_buf);
          local_1c0._8_8_ = local_1c0._8_8_ + -(long)local_1b0;
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_138,local_1c0._0_8_,
                     (char *)(local_1c0._8_8_ + local_1c0._0_8_));
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            uVar18 = local_180.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_138._M_string_length + local_180._M_string_length) {
            uVar18 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              uVar18 = local_138.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 < local_138._M_string_length + local_180._M_string_length)
            goto LAB_00293ce0;
            puVar17 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_138,0,(char *)0x0,(ulong)local_180._M_dataplus._M_p);
          }
          else {
LAB_00293ce0:
            puVar17 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_180,(ulong)local_138._M_dataplus._M_p);
          }
          local_1e8._0_8_ = local_1e8 + 0x10;
          pFVar24 = (FieldDescriptor *)(puVar17 + 2);
          if ((FieldDescriptor *)*puVar17 == pFVar24) {
            local_1d8._M_allocated_capacity = *(undefined8 *)pFVar24;
            local_1d8._8_8_ = puVar17[3];
          }
          else {
            local_1d8._M_allocated_capacity = *(undefined8 *)pFVar24;
            local_1e8._0_8_ = (FieldDescriptor *)*puVar17;
          }
          local_1e8._8_8_ = puVar17[1];
          *puVar17 = pFVar24;
          puVar17[1] = 0;
          *pFVar24 = (FieldDescriptor)0x0;
          std::__cxx11::string::operator=((string *)&local_208,(string *)local_1e8);
          if ((FieldDescriptor *)local_1e8._0_8_ != (FieldDescriptor *)(local_1e8 + 0x10)) {
            operator_delete((void *)local_1e8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p);
          }
          goto LAB_00293deb;
        }
        FieldDescriptor::message_type(pFVar4);
        iVar12 = anon_unknown_0::FindMessageIndexInFile
                           ((Descriptor *)
                            CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
        local_1e8._0_4_ = iVar12;
        pDVar15 = FieldDescriptor::message_type(pFVar4);
        QualifiedClassName_abi_cxx11_
                  ((string *)local_1c0,(cpp *)pDVar15,(Descriptor *)local_160,(Options *)options);
        Formatter::operator()
                  ((Formatter *)local_a8,
                   "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(static_cast< ::$proto_ns$::internal::SpecialSerializer>(::$proto_ns$::internal::MapFieldSerializer< ::$proto_ns$::internal::MapEntryToMapField<$3$>::MapFieldType, $tablename$::serialization_table>))},\n"
                   ,&local_184,(int *)local_1e8,(string *)local_1c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._0_8_ != local_1b0) {
          operator_delete((void *)local_1c0._0_8_);
        }
      }
      else {
LAB_00293deb:
        pFVar13 = FieldGeneratorMap::get(local_b0,pFVar4);
        uVar11 = anon_unknown_0::CalcFieldNum(pFVar13,pFVar4,local_160);
        local_118._M_dataplus._M_p._0_4_ = uVar11;
        if ((*(char *)(*(long *)(pFVar4 + 0x78) + 0x4d) == '\x01') && (*(int *)(pFVar4 + 0x3c) != 3)
           ) {
          if (*(once_flag **)(pFVar4 + 0x30) != (once_flag *)0x0) {
            local_1c0._0_8_ = FieldDescriptor::TypeOnceInit;
            local_1e8._0_8_ = pFVar4;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (*(once_flag **)(pFVar4 + 0x30),(_func_void_FieldDescriptor_ptr **)local_1c0,
                       (FieldDescriptor **)local_1e8);
          }
          if (*(int *)(pFVar4 + 0x38) == 0xb) {
            EVar3 = (local_1c8->options_).enforce_mode;
            if (EVar3 == kSpeed) {
              bVar7 = (local_1c8->options_).opensource_runtime;
            }
            else {
              if ((EVar3 == kLiteRuntime) ||
                 (*(int *)(*(long *)(*(long *)(pFVar4 + 0x28) + 0x88) + 0xa4) == 3))
              goto LAB_0029403b;
              bVar7 = (local_1c8->options_).opensource_runtime & 1;
            }
            if (bVar7 == 0) {
              local_118._M_dataplus._M_p._0_4_ = 0x69;
              local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"proto_ns","");
              pmVar14 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](local_38,&local_180);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1e8,"reinterpret_cast<const void*>(::",pmVar14);
              puVar17 = (undefined8 *)std::__cxx11::string::append((char *)local_1e8);
              paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar17 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar17 == paVar23) {
                local_1b0[0]._0_8_ = paVar23->_M_allocated_capacity;
                local_1b0[0]._8_8_ = puVar17[3];
                local_1c0._0_8_ = local_1b0;
              }
              else {
                local_1b0[0]._0_8_ = paVar23->_M_allocated_capacity;
                local_1c0._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar17;
              }
              local_1c0._8_8_ = puVar17[1];
              *puVar17 = paVar23;
              puVar17[1] = 0;
              *(undefined1 *)(puVar17 + 2) = 0;
              std::__cxx11::string::operator=((string *)&local_208,(string *)local_1c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._0_8_ != local_1b0) {
                operator_delete((void *)local_1c0._0_8_);
              }
              if ((FieldDescriptor *)local_1e8._0_8_ != (FieldDescriptor *)(local_1e8 + 0x10)) {
                operator_delete((void *)local_1e8._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p);
              }
              if ((*(long *)(pFVar4 + 0x58) == 0) &&
                 (*(int *)(*(long *)(local_1c8->descriptor_ + 0x10) + 0x3c) != 3)) {
                if (pFVar4[0x42] == (FieldDescriptor)0x0) {
                  plVar16 = (long *)(*(long *)(pFVar4 + 0x50) + 0x28);
                }
                else if (*(long *)(pFVar4 + 0x60) == 0) {
                  plVar16 = (long *)(*(long *)(pFVar4 + 0x28) + 0x80);
                }
                else {
                  plVar16 = (long *)(*(long *)(pFVar4 + 0x60) + 0x50);
                }
                if ((local_1c8->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [(int)((ulong)((long)pFVar4 - *plVar16) >> 3) * 0x286bca1b] == -1)
                goto LAB_00294024;
              }
              else {
LAB_00294024:
                std::__cxx11::string::append((char *)&local_208);
              }
              std::__cxx11::string::append((char *)&local_208);
            }
          }
        }
LAB_0029403b:
        if (*(char *)(*(long *)(pFVar4 + 0x78) + 0x4f) == '\x01') {
          Formatter::operator()
                    ((Formatter *)local_a8,
                     "{PROTOBUF_FIELD_OFFSET($classtype$, _weak_field_map_), $1$, $1$, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::WeakFieldSerializer)},\n"
                     ,&local_184);
        }
        else {
          if (*(long *)(pFVar4 + 0x58) == 0) {
            pcVar26 = "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, ~0u, $2$, $3$},\n";
            if (*(int *)(*(long *)(local_1c8->descriptor_ + 0x10) + 0x3c) != 3) {
              if (pFVar4[0x42] == (FieldDescriptor)0x0) {
                plVar16 = (long *)(*(long *)(pFVar4 + 0x50) + 0x28);
              }
              else if (*(long *)(pFVar4 + 0x60) == 0) {
                plVar16 = (long *)(*(long *)(pFVar4 + 0x28) + 0x80);
              }
              else {
                plVar16 = (long *)(*(long *)(pFVar4 + 0x60) + 0x50);
              }
              pcVar26 = "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, ~0u, $2$, $3$},\n"
              ;
              if ((local_1c8->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start
                  [(int)((ulong)((long)pFVar4 - *plVar16) >> 3) * 0x286bca1b] != -1) {
                local_1c0._0_8_ = local_1b0;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1c0,"hasbitsoffset","");
                if (pFVar4[0x42] == (FieldDescriptor)0x0) {
                  plVar16 = (long *)(*(long *)(pFVar4 + 0x50) + 0x28);
                }
                else if (*(long *)(pFVar4 + 0x60) == 0) {
                  plVar16 = (long *)(*(long *)(pFVar4 + 0x28) + 0x80);
                }
                else {
                  plVar16 = (long *)(*(long *)(pFVar4 + 0x60) + 0x50);
                }
                Formatter::Set<int>((Formatter *)local_a8,(string *)local_1c0,
                                    (local_1c8->has_bit_indices_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start +
                                    (int)((ulong)((long)pFVar4 - *plVar16) >> 3) * 0x286bca1b);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1c0._0_8_ != local_1b0) {
                  operator_delete((void *)local_1c0._0_8_);
                }
                pcVar26 = 
                "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_) * 8 + $hasbitsoffset$, $2$, $3$},\n"
                ;
              }
            }
          }
          else {
            local_1c0._0_8_ = local_1b0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"oneofoffset","");
            local_1e8._0_8_ =
                 (long)((int)((ulong)(*(long *)(pFVar4 + 0x58) -
                                     *(long *)(*(long *)(*(long *)(pFVar4 + 0x58) + 0x10) + 0x30))
                             >> 4) * -0x55555555) << 2;
            Formatter::Set<unsigned_long>
                      ((Formatter *)local_a8,(string *)local_1c0,(unsigned_long *)local_1e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._0_8_ != local_1b0) {
              operator_delete((void *)local_1c0._0_8_);
            }
            pcVar26 = 
            "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_) + $oneofoffset$, $2$, $3$},\n"
            ;
          }
          Formatter::operator()
                    ((Formatter *)local_a8,pcVar26,&local_184,(int *)&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208
                    );
        }
      }
      if ((FieldDescriptor *)local_208._M_p != local_1f8) {
        operator_delete(local_208._M_p);
      }
      if ((FieldDescriptor *)local_f8._0_8_ != (FieldDescriptor *)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_);
      }
      lVar27 = lVar27 + 1;
    } while( true );
  }
  local_b0 = &this->field_generators_;
  uVar18 = CONCAT71((int7)((ulong)local_b0 >> 8),1);
  lVar27 = 0;
  do {
    local_188 = (uint)uVar18;
    pFVar4 = local_50.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar27];
    pFVar13 = FieldGeneratorMap::get(local_b0,pFVar4);
    iVar12 = *(int *)(pFVar4 + 0x44);
    if (*(once_flag **)(pFVar4 + 0x30) != (once_flag *)0x0) {
      local_1c0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_f8._0_8_ = pFVar4;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar4 + 0x30),(_func_void_FieldDescriptor_ptr **)local_1c0,
                 (FieldDescriptor **)local_f8);
    }
    uVar1 = *(uint *)(internal::WireFormatLite::kWireTypeForFieldType +
                     (ulong)*(uint *)(pFVar4 + 0x38) * 4);
    local_f8._8_4_ = _S_red;
    local_e8._M_allocated_capacity = 0;
    local_e8._8_8_ = local_f8 + 8;
    local_d0 = 0;
    local_d8 = (_Base_ptr)local_e8._8_8_;
    QualifiedClassName_abi_cxx11_
              ((string *)local_1c0,(cpp *)local_1c8->descriptor_,(Descriptor *)local_160,
               (Options *)0x0);
    local_208._M_p = (pointer)local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"classtype","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_f8,(key_type *)&local_208);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_1c0);
    pFVar24 = extraout_RDX;
    if ((FieldDescriptor *)local_208._M_p != local_1f8) {
      operator_delete(local_208._M_p);
      pFVar24 = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != local_1b0) {
      operator_delete((void *)local_1c0._0_8_);
      pFVar24 = extraout_RDX_01;
    }
    FieldName_abi_cxx11_((string *)local_1c0,(cpp *)pFVar4,pFVar24);
    local_208._M_p = (pointer)local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"field_name","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_f8,(key_type *)&local_208);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)local_1c0);
    if ((FieldDescriptor *)local_208._M_p != local_1f8) {
      operator_delete(local_208._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != local_1b0) {
      operator_delete((void *)local_1c0._0_8_);
    }
    local_1c0._0_8_ = local_1b0;
    local_1c0._8_8_ = FastUInt32ToBufferLeft(iVar12 << 3 | uVar1,local_1b0[0]._M_local_buf);
    local_1c0._8_8_ = local_1c0._8_8_ + -(long)local_1b0;
    local_208._M_p = (pointer)local_1f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,local_1c0._0_8_,(char *)(local_1c0._8_8_ + local_1c0._0_8_));
    local_1e8._0_8_ = local_1e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"tag","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_f8,(key_type *)local_1e8);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_208);
    if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
      operator_delete((void *)local_1e8._0_8_);
    }
    if ((FieldDescriptor *)local_208._M_p != local_1f8) {
      operator_delete(local_208._M_p);
    }
    local_1c0._0_8_ = local_1b0;
    local_1c0._8_8_ = FastInt32ToBufferLeft((int32)lVar27,local_1b0[0]._M_local_buf);
    local_1c0._8_8_ = local_1c0._8_8_ + -(long)local_1b0;
    local_208._M_p = (pointer)local_1f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,local_1c0._0_8_,(char *)(local_1c0._8_8_ + local_1c0._0_8_));
    local_1e8._0_8_ = local_1e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"hasbit","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_f8,(key_type *)local_1e8);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_208);
    if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
      operator_delete((void *)local_1e8._0_8_);
    }
    if ((FieldDescriptor *)local_208._M_p != local_1f8) {
      operator_delete(local_208._M_p);
    }
    uVar11 = anon_unknown_0::CalcFieldNum(pFVar13,pFVar4,local_160);
    local_1c0._0_8_ = local_1b0;
    local_1c0._8_8_ = FastUInt32ToBufferLeft(uVar11,local_1b0[0]._M_local_buf);
    local_1c0._8_8_ = local_1c0._8_8_ + -(long)local_1b0;
    local_208._M_p = (pointer)local_1f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,local_1c0._0_8_,(char *)(local_1c0._8_8_ + local_1c0._0_8_));
    local_1e8._0_8_ = local_1e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"type","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_f8,(key_type *)local_1e8);
    std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_208);
    if ((FieldDescriptor *)local_1e8._0_8_ != (FieldDescriptor *)(local_1e8 + 0x10)) {
      operator_delete((void *)local_1e8._0_8_);
    }
    if ((FieldDescriptor *)local_208._M_p != local_1f8) {
      operator_delete(local_208._M_p);
    }
    local_1c0._0_8_ = local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"ptr","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_f8,(key_type *)local_1c0);
    std::__cxx11::string::_M_replace((ulong)pmVar14,0,(char *)pmVar14->_M_string_length,0x393494);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != local_1b0) {
      operator_delete((void *)local_1c0._0_8_);
    }
    if (*(once_flag **)(pFVar4 + 0x30) != (once_flag *)0x0) {
      local_1c0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_208._M_p = (pointer)pFVar4;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar4 + 0x30),(_func_void_FieldDescriptor_ptr **)local_1c0,
                 (FieldDescriptor **)&local_208);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar4 + 0x38) * 4) == 10) {
      pDVar15 = FieldDescriptor::message_type(pFVar4);
      if (*(char *)(*(long *)(pDVar15 + 0x20) + 0x4b) == '\x01') {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_1c0,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0x708);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)local_1c0,
                           "CHECK failed: !IsMapEntryMessage(field->message_type()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_208,other);
        internal::LogMessage::~LogMessage((LogMessage *)local_1c0);
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"TableStruct","");
      pDVar15 = FieldDescriptor::message_type(pFVar4);
      UniqueName(&local_118,&local_70,(string *)**(undefined8 **)(pDVar15 + 0x10),local_160);
      plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,0x3a8ad1);
      puVar21 = (ulong *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar21) {
        local_180.field_2._M_allocated_capacity = *puVar21;
        local_180.field_2._8_8_ = plVar16[3];
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      }
      else {
        local_180.field_2._M_allocated_capacity = *puVar21;
        local_180._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_180._M_string_length = plVar16[1];
      *plVar16 = (long)puVar21;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      puVar17 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
      local_1e8._0_8_ = local_1e8 + 0x10;
      pFVar24 = (FieldDescriptor *)(puVar17 + 2);
      if ((FieldDescriptor *)*puVar17 == pFVar24) {
        local_1d8._M_allocated_capacity = *(undefined8 *)pFVar24;
        local_1d8._8_8_ = puVar17[3];
      }
      else {
        local_1d8._M_allocated_capacity = *(undefined8 *)pFVar24;
        local_1e8._0_8_ = (FieldDescriptor *)*puVar17;
      }
      local_1e8._8_8_ = puVar17[1];
      *puVar17 = pFVar24;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      FieldDescriptor::message_type(pFVar4);
      iVar12 = anon_unknown_0::FindMessageIndexInFile
                         ((Descriptor *)
                          CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
      local_1c0._0_8_ = local_1b0;
      local_1c0._8_8_ = FastInt32ToBufferLeft(iVar12,local_1b0[0]._M_local_buf);
      local_1c0._8_8_ = local_1c0._8_8_ + -(long)local_1b0;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_158,local_1c0._0_8_,(char *)(local_1c0._8_8_ + local_1c0._0_8_));
      uVar18 = 0xf;
      if ((FieldDescriptor *)local_1e8._0_8_ != (FieldDescriptor *)(local_1e8 + 0x10)) {
        uVar18 = local_1d8._M_allocated_capacity;
      }
      if ((ulong)uVar18 < local_158._M_string_length + local_1e8._8_8_) {
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          uVar18 = local_158.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_158._M_string_length + local_1e8._8_8_) goto LAB_00293552;
        puVar17 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,local_1e8._0_8_);
      }
      else {
LAB_00293552:
        puVar17 = (undefined8 *)
                  std::__cxx11::string::_M_append(local_1e8,(ulong)local_158._M_dataplus._M_p);
      }
      pFVar4 = (FieldDescriptor *)(puVar17 + 2);
      if ((FieldDescriptor *)*puVar17 == pFVar4) {
        local_1f8 = *(FieldDescriptor (*) [8])pFVar4;
        in_stack_fffffffffffffe10 = *(undefined4 *)(puVar17 + 3);
        in_stack_fffffffffffffe14 = *(undefined4 *)((long)puVar17 + 0x1c);
        local_208._M_p = (pointer)local_1f8;
      }
      else {
        local_1f8 = *(FieldDescriptor (*) [8])pFVar4;
        local_208._M_p = (pointer)*puVar17;
      }
      local_200 = puVar17[1];
      *puVar17 = pFVar4;
      puVar17[1] = 0;
      *pFVar4 = (FieldDescriptor)0x0;
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"ptr","");
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_f8,&local_138);
      std::__cxx11::string::operator=((string *)pmVar14,(string *)&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((FieldDescriptor *)local_208._M_p != local_1f8) {
        operator_delete(local_208._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      if ((FieldDescriptor *)local_1e8._0_8_ != (FieldDescriptor *)(local_1e8 + 0x10)) {
        operator_delete((void *)local_1e8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    local_1c0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_a8;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_1c0 + 8),
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_a8 + 8));
    Formatter::AddMap((Formatter *)local_a8,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_f8);
    Formatter::operator()<>
              ((Formatter *)local_a8,
               "{PROTOBUF_FIELD_OFFSET(::$proto_ns$::internal::MapEntryHelper<$classtype$::SuperType>, $field_name$_), $tag$,PROTOBUF_FIELD_OFFSET(::$proto_ns$::internal::MapEntryHelper<$classtype$::SuperType>, _has_bits_) * 8 + $hasbit$, $type$, $ptr$},\n"
              );
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::swap((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_1c0._0_8_ + 8),
           (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_1c0 + 8));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_1c0 + 8));
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_f8);
    lVar27 = 1;
    uVar18 = 0;
  } while ((local_188 & 1) != 0);
  iVar12 = 2;
  goto LAB_002942cf;
LAB_00294221:
  EVar3 = (local_1c8->options_).enforce_mode;
  if ((EVar3 == kSpeed) ||
     ((pcVar26 = "UnknownFieldSerializerLite", EVar3 != kLiteRuntime &&
      (*(int *)(*(long *)(*(long *)(local_1c8->descriptor_ + 0x10) + 0x88) + 0xa4) != 3)))) {
    pcVar26 = "UnknownFieldSetSerializer";
  }
  local_1c0._0_8_ = local_1b0;
  sVar20 = strlen(pcVar26);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,pcVar26,pcVar26 + sVar20);
  Formatter::operator()
            ((Formatter *)local_a8,
             "{PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_), 0, ~0u, ::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const void*>(::$proto_ns$::internal::$1$)},\n"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != local_1b0) {
    operator_delete((void *)local_1c0._0_8_);
  }
  if (local_c8.
      super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (ExtensionRange **)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar12 = (int)uVar30 + (int)lVar27 + 2;
LAB_002942cf:
  if (local_50.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_002942e1:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_a8 + 8));
  return iVar12;
}

Assistant:

int MessageGenerator::GenerateFieldMetadata(io::Printer* printer) {
  Formatter format(printer, variables_);
  if (!options_.table_driven_serialization) {
    return 0;
  }

  std::vector<const FieldDescriptor*> sorted = SortFieldsByNumber(descriptor_);
  if (IsMapEntryMessage(descriptor_)) {
    for (int i = 0; i < 2; i++) {
      const FieldDescriptor* field = sorted[i];
      const FieldGenerator& generator = field_generators_.get(field);

      uint32 tag = internal::WireFormatLite::MakeTag(
          field->number(), WireFormat::WireTypeForFieldType(field->type()));

      std::map<std::string, std::string> vars;
      vars["classtype"] = QualifiedClassName(descriptor_, options_);
      vars["field_name"] = FieldName(field);
      vars["tag"] = StrCat(tag);
      vars["hasbit"] = StrCat(i);
      vars["type"] = StrCat(CalcFieldNum(generator, field, options_));
      vars["ptr"] = "nullptr";
      if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
        GOOGLE_CHECK(!IsMapEntryMessage(field->message_type()));
        vars["ptr"] =
            "::" + UniqueName("TableStruct", field->message_type(), options_) +
            "::serialization_table + " +
            StrCat(FindMessageIndexInFile(field->message_type()));
      }
      Formatter::SaveState saver(&format);
      format.AddMap(vars);
      format(
          "{PROTOBUF_FIELD_OFFSET("
          "::$proto_ns$::internal::MapEntryHelper<$classtype$::"
          "SuperType>, $field_name$_), $tag$,"
          "PROTOBUF_FIELD_OFFSET("
          "::$proto_ns$::internal::MapEntryHelper<$classtype$::"
          "SuperType>, _has_bits_) * 8 + $hasbit$, $type$, "
          "$ptr$},\n");
    }
    return 2;
  }
  format(
      "{PROTOBUF_FIELD_OFFSET($classtype$, _cached_size_),"
      " 0, 0, 0, nullptr},\n");
  std::vector<const Descriptor::ExtensionRange*> sorted_extensions;
  sorted_extensions.reserve(descriptor_->extension_range_count());
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  std::sort(sorted_extensions.begin(), sorted_extensions.end(),
            ExtensionRangeSorter());
  for (int i = 0, extension_idx = 0; /* no range */; i++) {
    for (; extension_idx < sorted_extensions.size() &&
           (i == sorted.size() ||
            sorted_extensions[extension_idx]->start < sorted[i]->number());
         extension_idx++) {
      const Descriptor::ExtensionRange* range =
          sorted_extensions[extension_idx];
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, _extensions_), "
          "$1$, $2$, ::$proto_ns$::internal::FieldMetadata::kSpecial, "
          "reinterpret_cast<const "
          "void*>(::$proto_ns$::internal::ExtensionSerializer)},\n",
          range->start, range->end);
    }
    if (i == sorted.size()) break;
    const FieldDescriptor* field = sorted[i];

    uint32 tag = internal::WireFormatLite::MakeTag(
        field->number(), WireFormat::WireTypeForFieldType(field->type()));
    if (field->is_packed()) {
      tag = internal::WireFormatLite::MakeTag(
          field->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
    }

    std::string classfieldname = FieldName(field);
    if (field->containing_oneof()) {
      classfieldname = field->containing_oneof()->name();
    }
    format.Set("field_name", classfieldname);
    std::string ptr = "nullptr";
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (IsMapEntryMessage(field->message_type())) {
        format(
            "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$, $2$, "
            "::$proto_ns$::internal::FieldMetadata::kSpecial, "
            "reinterpret_cast<const void*>(static_cast< "
            "::$proto_ns$::internal::SpecialSerializer>("
            "::$proto_ns$::internal::MapFieldSerializer< "
            "::$proto_ns$::internal::MapEntryToMapField<"
            "$3$>::MapFieldType, "
            "$tablename$::serialization_table>))},\n",
            tag, FindMessageIndexInFile(field->message_type()),
            QualifiedClassName(field->message_type(), options_));
        continue;
      } else if (!field->message_type()->options().message_set_wire_format()) {
        // message_set doesn't have the usual table and we need to
        // dispatch to generated serializer, hence ptr stays zero.
        ptr =
            "::" + UniqueName("TableStruct", field->message_type(), options_) +
            "::serialization_table + " +
            StrCat(FindMessageIndexInFile(field->message_type()));
      }
    }

    const FieldGenerator& generator = field_generators_.get(field);
    int type = CalcFieldNum(generator, field, options_);

    if (IsLazy(field, options_)) {
      type = internal::FieldMetadata::kSpecial;
      ptr = "reinterpret_cast<const void*>(::" + variables_["proto_ns"] +
            "::internal::LazyFieldSerializer";
      if (field->containing_oneof()) {
        ptr += "OneOf";
      } else if (!HasFieldPresence(descriptor_->file()) ||
                 has_bit_indices_[field->index()] == -1) {
        ptr += "NoPresence";
      }
      ptr += ")";
    }

    if (field->options().weak()) {
      // TODO(gerbens) merge weak fields into ranges
      format(
          "{PROTOBUF_FIELD_OFFSET("
          "$classtype$, _weak_field_map_), $1$, $1$, "
          "::$proto_ns$::internal::FieldMetadata::kSpecial, "
          "reinterpret_cast<const "
          "void*>(::$proto_ns$::internal::WeakFieldSerializer)},\n",
          tag);
    } else if (field->containing_oneof()) {
      format.Set("oneofoffset",
                 sizeof(uint32) * field->containing_oneof()->index());
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), $1$,"
          " PROTOBUF_FIELD_OFFSET($classtype$, _oneof_case_) + "
          "$oneofoffset$, $2$, $3$},\n",
          tag, type, ptr);
    } else if (HasFieldPresence(descriptor_->file()) &&
               has_bit_indices_[field->index()] != -1) {
      format.Set("hasbitsoffset", has_bit_indices_[field->index()]);
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), "
          "$1$, PROTOBUF_FIELD_OFFSET($classtype$, _has_bits_) * 8 + "
          "$hasbitsoffset$, $2$, $3$},\n",
          tag, type, ptr);
    } else {
      format(
          "{PROTOBUF_FIELD_OFFSET($classtype$, $field_name$_), "
          "$1$, ~0u, $2$, $3$},\n",
          tag, type, ptr);
    }
  }
  int num_field_metadata = 1 + sorted.size() + sorted_extensions.size();
  num_field_metadata++;
  std::string serializer = UseUnknownFieldSet(descriptor_->file(), options_)
                               ? "UnknownFieldSetSerializer"
                               : "UnknownFieldSerializerLite";
  format(
      "{PROTOBUF_FIELD_OFFSET($classtype$, _internal_metadata_), 0, ~0u, "
      "::$proto_ns$::internal::FieldMetadata::kSpecial, reinterpret_cast<const "
      "void*>(::$proto_ns$::internal::$1$)},\n",
      serializer);
  return num_field_metadata;
}